

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O2

string * __thiscall
absl::lts_20250127::StatusCodeToString_abi_cxx11_
          (string *__return_storage_ptr__,lts_20250127 *this,StatusCode code)

{
  char *__s;
  allocator<char> local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = "OK";
    break;
  case 1:
    __s = "CANCELLED";
    break;
  case 2:
    __s = "UNKNOWN";
    break;
  case 3:
    __s = "INVALID_ARGUMENT";
    break;
  case 4:
    __s = "DEADLINE_EXCEEDED";
    break;
  case 5:
    __s = "NOT_FOUND";
    break;
  case 6:
    __s = "ALREADY_EXISTS";
    break;
  case 7:
    __s = "PERMISSION_DENIED";
    break;
  case 8:
    __s = "RESOURCE_EXHAUSTED";
    break;
  case 9:
    __s = "FAILED_PRECONDITION";
    break;
  case 10:
    __s = "ABORTED";
    break;
  case 0xb:
    __s = "OUT_OF_RANGE";
    break;
  case 0xc:
    __s = "UNIMPLEMENTED";
    break;
  case 0xd:
    __s = "INTERNAL";
    break;
  case 0xe:
    __s = "UNAVAILABLE";
    break;
  case 0xf:
    __s = "DATA_LOSS";
    break;
  case 0x10:
    __s = "UNAUTHENTICATED";
    break;
  default:
    __s = "";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string StatusCodeToString(StatusCode code) {
  switch (code) {
    case StatusCode::kOk:
      return "OK";
    case StatusCode::kCancelled:
      return "CANCELLED";
    case StatusCode::kUnknown:
      return "UNKNOWN";
    case StatusCode::kInvalidArgument:
      return "INVALID_ARGUMENT";
    case StatusCode::kDeadlineExceeded:
      return "DEADLINE_EXCEEDED";
    case StatusCode::kNotFound:
      return "NOT_FOUND";
    case StatusCode::kAlreadyExists:
      return "ALREADY_EXISTS";
    case StatusCode::kPermissionDenied:
      return "PERMISSION_DENIED";
    case StatusCode::kUnauthenticated:
      return "UNAUTHENTICATED";
    case StatusCode::kResourceExhausted:
      return "RESOURCE_EXHAUSTED";
    case StatusCode::kFailedPrecondition:
      return "FAILED_PRECONDITION";
    case StatusCode::kAborted:
      return "ABORTED";
    case StatusCode::kOutOfRange:
      return "OUT_OF_RANGE";
    case StatusCode::kUnimplemented:
      return "UNIMPLEMENTED";
    case StatusCode::kInternal:
      return "INTERNAL";
    case StatusCode::kUnavailable:
      return "UNAVAILABLE";
    case StatusCode::kDataLoss:
      return "DATA_LOSS";
    default:
      return "";
  }
}